

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

Boundary_simplex_range * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
boundary_simplex_range<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>>
          (Boundary_simplex_range *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
          *sh)

{
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_1b0;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_1a8;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_e0;
  
  local_1b0 = (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               )sh->m_ptr;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>::
  Simplex_tree_boundary_simplex_iterator<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>>
            ((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
              *)&local_e0,this,&local_1b0);
  local_1a8.last_ = this->null_vertex_;
  local_1a8.suffix_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = 0;
  local_1a8.sib_ = (Siblings *)0x0;
  local_1a8.sh_.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_1a8.next_ = local_1a8.last_;
  local_1a8.st_ = this;
  boost::
  iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>
  ::
  iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>
            ((iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>
              *)__return_storage_ptr__,&local_e0,&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

Boundary_simplex_range boundary_simplex_range(SimplexHandle sh) const {
    return Boundary_simplex_range(Boundary_simplex_iterator(this, sh),
                                  Boundary_simplex_iterator(this));
  }